

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O1

ByteData * __thiscall
cfd::core::ByteData::Serialize(ByteData *__return_storage_ptr__,ByteData *this)

{
  uint8_t *buffer;
  Serializer obj;
  allocator_type local_49;
  Serializer local_48;
  
  local_48._vptr_Serializer = (_func_int **)&PTR__Serializer_007e4d98;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_48.buffer_,
             (ulong)(uint)(*(int *)&(this->data_).
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                          *(int *)&(this->data_).
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start) + 9,&local_49);
  local_48.offset_ = 0;
  buffer = (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  Serializer::AddVariableBuffer
            (&local_48,buffer,
             *(int *)&(this->data_).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (int)buffer);
  ByteData(__return_storage_ptr__,
           local_48.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start,local_48.offset_);
  local_48._vptr_Serializer = (_func_int **)&PTR__Serializer_007e4d98;
  if (local_48.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uint8_t *)0x0) {
    operator_delete(local_48.buffer_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.buffer_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.buffer_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData ByteData::Serialize() const {
  Serializer obj(static_cast<uint32_t>(data_.size()));
  obj.AddVariableBuffer(data_.data(), static_cast<uint32_t>(data_.size()));
  return obj.Output();
}